

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O2

int coda_mem_array_set_element(coda_mem_array *type,long index,coda_dynamic_type *element)

{
  long lVar1;
  char *pcVar2;
  int err;
  undefined8 uVar3;
  
  if (type == (coda_mem_array *)0x0) {
    pcVar2 = "type argument is NULL (%s:%u)";
    uVar3 = 0x27f;
  }
  else {
    lVar1 = type->num_elements;
    if (index < 0 || lVar1 <= index) {
      coda_set_error(-0x65,"array index (%ld) is not in the range [0,%ld) (%s:%u)",index,lVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                     ,0x285);
      return -1;
    }
    if (element != (coda_dynamic_type *)0x0) {
      if (type->element[index] == (coda_dynamic_type *)0x0) {
        if (type->definition->base_type == element->definition) {
          type->element[index] = element;
          return 0;
        }
        pcVar2 = "trying to set array element \'%ld\' of incompatible type (%s:%u)";
        err = -400;
        uVar3 = 0x296;
      }
      else {
        pcVar2 = "array element \'%ld\' is already set (%s:%u)";
        err = -100;
        uVar3 = 0x290;
        lVar1 = index;
      }
      coda_set_error(err,pcVar2,lVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                     ,uVar3);
      return -1;
    }
    pcVar2 = "element argument is NULL (%s:%u)";
    uVar3 = 0x28a;
  }
  coda_set_error(-100,pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                 ,uVar3);
  return -1;
}

Assistant:

int coda_mem_array_set_element(coda_mem_array *type, long index, coda_dynamic_type *element)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (index < 0 || index >= type->num_elements)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "array index (%ld) is not in the range [0,%ld) (%s:%u)", index,
                       type->num_elements, __FILE__, __LINE__);
        return -1;
    }
    if (element == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "element argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->element[index] != NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "array element '%ld' is already set (%s:%u)", index, __FILE__,
                       __LINE__);
        return -1;
    }
    if (type->definition->base_type != element->definition)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "trying to set array element '%ld' of incompatible type (%s:%u)",
                       type->num_elements, __FILE__, __LINE__);
        return -1;
    }
    type->element[index] = element;

    return 0;
}